

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O3

void drinksink(void)

{
  undefined1 *puVar1;
  boolean bVar2;
  schar sVar3;
  uint uVar4;
  int iVar5;
  obj *poVar6;
  monst *pmVar7;
  ulong uVar8;
  char *pcVar9;
  char *line;
  
  if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
     ((youmonst.data)->mlet == '\x05')) {
    line = "You are floating high above the %s.";
    pcVar9 = "sink";
    goto LAB_001a1d89;
  }
  uVar4 = mt_random();
  switch(uVar4 % 0x14) {
  case 0:
    pcVar9 = "You take a sip of very cold water.";
    break;
  case 1:
    pcVar9 = "You take a sip of very warm water.";
    break;
  case 2:
    pline("You take a sip of scalding hot water.");
    if (u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) {
      uVar8 = 6;
LAB_001a2116:
      if (((byte)youmonst.mintrinsics & 1) == 0) {
        uVar4 = mt_random();
        losehp((int)((ulong)uVar4 % uVar8) + 1,"sipping boiling water",1);
        return;
      }
    }
    else if (((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
            ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) {
      uVar8 = 3;
      goto LAB_001a2116;
    }
    pcVar9 = "It seems quite tasty.";
    break;
  case 3:
    if ((mvitals[0x5a].mvflags & 3) != 0) {
      pcVar9 = "The sink seems quite dirty.";
      break;
    }
    pmVar7 = makemon(mons + 0x5a,level,(int)u.ux,(int)u.uy,0);
    if (pmVar7 == (monst *)0x0) {
      return;
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a22ae;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a22a9;
LAB_001a233a:
      if (pmVar7->wormno == '\0') {
        if ((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) goto LAB_001a23d6;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a2386;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a237d;
        }
        else {
LAB_001a237d:
          if (ublindf == (obj *)0x0) goto LAB_001a241d;
LAB_001a2386:
          if (ublindf->oartifact != '\x1d') goto LAB_001a241d;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0)) &&
           ((pmVar7->data->mflags3 & 0x200) != 0)) goto LAB_001a23d6;
LAB_001a241d:
        if (((pmVar7->data->mflags1 & 0x10000) == 0) &&
           ((poVar6 = which_armor(pmVar7,4), poVar6 == (obj *)0x0 ||
            (poVar6 = which_armor(pmVar7,4), poVar6->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a2468;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a2463;
          }
          else {
LAB_001a2463:
            if (ublindf != (obj *)0x0) {
LAB_001a2468:
              if (ublindf->oartifact == '\x1d') goto LAB_001a24e1;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001a2534;
          }
LAB_001a24e1:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar5 = dist2((int)pmVar7->mx,(int)pmVar7->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))
          goto LAB_001a2534;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(pmVar7), bVar2 == '\0'))))
        goto LAB_001a22b8;
      }
      else {
        bVar2 = worm_known(level,pmVar7);
        if (bVar2 == '\0') goto LAB_001a241d;
LAB_001a23d6:
        uVar4 = *(uint *)&pmVar7->field_0x60;
        if ((((uVar4 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)
           ) {
          if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_001a240f;
          goto LAB_001a241d;
        }
        if ((uVar4 & 0x280) != 0) goto LAB_001a241d;
LAB_001a240f:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_001a241d;
      }
LAB_001a2534:
      pcVar9 = a_monnam(pmVar7);
    }
    else {
LAB_001a22a9:
      if (ublindf != (obj *)0x0) {
LAB_001a22ae:
        if (ublindf->oartifact == '\x1d') goto LAB_001a233a;
      }
LAB_001a22b8:
      pcVar9 = "something squirmy";
    }
    line = "Eek!  There\'s %s in the sink!";
    goto LAB_001a1d89;
  case 4:
    while( true ) {
      poVar6 = mkobj(level,'\b','\0');
      if (poVar6->otyp != 0x14f) break;
      obfree(poVar6,(obj *)0x0);
    }
    poVar6->field_0x4a = poVar6->field_0x4a & 0xfc;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a1ee5;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a1ee0;
LAB_001a2173:
      hcolor(obj_descr[objects[poVar6->otyp].oc_descr_idx].oc_descr);
    }
    else {
LAB_001a1ee0:
      if (ublindf != (obj *)0x0) {
LAB_001a1ee5:
        if (ublindf->oartifact == '\x1d') goto LAB_001a2173;
      }
    }
    uVar4 = 0;
    pline("Some %s liquid flows from the faucet.");
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a21c6;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a21c1;
    }
    else {
LAB_001a21c1:
      if (ublindf == (obj *)0x0) goto LAB_001a222e;
LAB_001a21c6:
      uVar4 = 0;
      if (ublindf->oartifact != '\x1d') goto LAB_001a222e;
    }
    uVar4 = 0x20;
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       (uVar4 = 0, u.umonnum != u.umonster)) {
      bVar2 = dmgtype(youmonst.data,0x24);
      uVar4 = (uint)(bVar2 != '\0') << 5;
    }
LAB_001a222e:
    *(uint *)&poVar6->field_0x4a = *(uint *)&poVar6->field_0x4a & 0xffffffdf | uVar4;
    poVar6->quan = poVar6->quan + 1;
    poVar6->corpsenm = 1;
    dopotion(poVar6);
    obfree(poVar6,(obj *)0x0);
    return;
  case 5:
    if ((level->locations[u.ux][u.uy].field_0x6 & 0x40) == 0) {
      pline("You find a ring in the sink!");
      mkobj_at('\x04',level,(int)u.ux,(int)u.uy,'\x01');
      puVar1 = &level->locations[u.ux][u.uy].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x40;
      exercise(2,'\x01');
      newsym((int)u.ux,(int)u.uy);
      return;
    }
    pcVar9 = "Some dirty water backs up in the drain.";
    break;
  case 6:
    breaksink((int)u.ux,(int)u.uy);
    return;
  case 7:
    pline("The water moves as though of its own will!");
    if (((mvitals[0xa2].mvflags & 3) == 0) &&
       (pmVar7 = makemon(mons + 0xa2,level,(int)u.ux,(int)u.uy,0), pmVar7 != (monst *)0x0)) {
      return;
    }
    pcVar9 = "But it quiets down.";
    break;
  case 8:
    pline("Yuk, this water tastes awful.");
    more_experienced(1,1,0);
    newexplevel();
    return;
  case 9:
    pline("Gaggg... this tastes like sewage!  You vomit.");
    sVar3 = acurr(4);
    uVar4 = mt_random();
    morehungry(SUB164(ZEXT416(uVar4) % SEXT816(0x1e - (long)sVar3),0) + 0xb);
    vomit();
    return;
  case 10:
    pline("This water contains toxic wastes!");
    if (u.uprops[0x3d].extrinsic != 0 || u.uprops[0x3d].intrinsic != 0) {
      return;
    }
    pline("You undergo a freakish metamorphosis!");
    polyself('\0');
    return;
  case 0xb:
    pcVar9 = "clanking from the pipes...";
    goto LAB_001a1fa8;
  case 0xc:
    pcVar9 = "snatches of song from among the sewers...";
LAB_001a1fa8:
    You_hear(pcVar9);
    return;
  case 0x13:
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))) {
      pcVar9 = "From the murky drain, a hand reaches up... --oops--";
      break;
    }
  default:
    uVar4 = mt_random();
    if (uVar4 * -0x55555555 < 0x55555556) {
      pcVar9 = "hot";
    }
    else {
      uVar4 = mt_random();
      pcVar9 = "cold";
      if ((uVar4 & 1) == 0) {
        pcVar9 = "warm";
      }
    }
    line = "You take a sip of %s water.";
LAB_001a1d89:
    pline(line,pcVar9);
    return;
  }
  pline(pcVar9);
  return;
}

Assistant:

void drinksink(void)
{
	struct obj *otmp;
	struct monst *mtmp;

	if (Levitation) {
		floating_above("sink");
		return;
	}
	switch(rn2(20)) {
		case 0: pline("You take a sip of very cold water.");
			break;
		case 1: pline("You take a sip of very warm water.");
			break;
		case 2: pline("You take a sip of scalding hot water.");
			if (FFire_resistance) {
				pline("It seems quite tasty.");
			} else {
				losehp(rnd(PFire_resistance ? 3 : 6),
				       "sipping boiling water", KILLED_BY);
			}
			break;
		case 3: if (mvitals[PM_SEWER_RAT].mvflags & G_GONE)
				pline("The sink seems quite dirty.");
			else {
				mtmp = makemon(&mons[PM_SEWER_RAT], level,
						u.ux, u.uy, NO_MM_FLAGS);
				if (mtmp) pline("Eek!  There's %s in the sink!",
					(Blind || !canspotmon(level, mtmp)) ?
					"something squirmy" :
					a_monnam(mtmp));
			}
			break;
		case 4: do {
				otmp = mkobj(level, POTION_CLASS,FALSE);
				if (otmp->otyp == POT_WATER) {
					obfree(otmp, NULL);
					otmp = NULL;
				}
			} while (!otmp);
			otmp->cursed = otmp->blessed = 0;
			pline("Some %s liquid flows from the faucet.",
			      Blind ? "odd" :
			      hcolor(OBJ_DESCR(objects[otmp->otyp])));
			otmp->dknown = !(Blind || Hallucination);
			otmp->quan++; /* Avoid panic upon useup() */
			otmp->fromsink = 1; /* kludge for docall() */
			dopotion(otmp);
			obfree(otmp, NULL);
			break;
		case 5: if (!(level->locations[u.ux][u.uy].looted & S_LRING)) {
			    pline("You find a ring in the sink!");
			    mkobj_at(RING_CLASS, level, u.ux, u.uy, TRUE);
			    level->locations[u.ux][u.uy].looted |= S_LRING;
			    exercise(A_WIS, TRUE);
			    newsym(u.ux,u.uy);
			} else pline("Some dirty water backs up in the drain.");
			break;
		case 6: breaksink(u.ux,u.uy);
			break;
		case 7: pline("The water moves as though of its own will!");
			if ((mvitals[PM_WATER_ELEMENTAL].mvflags & G_GONE)
			    || !makemon(&mons[PM_WATER_ELEMENTAL], level,
					u.ux, u.uy, NO_MM_FLAGS))
				pline("But it quiets down.");
			break;
		case 8: pline("Yuk, this water tastes awful.");
			more_experienced(1, 1, 0);
			newexplevel();
			break;
		case 9: pline("Gaggg... this tastes like sewage!  You vomit.");
			morehungry(rn1(30-ACURR(A_CON), 11));
			vomit();
			break;
		case 10: pline("This water contains toxic wastes!");
			if (!Unchanging) {
				pline("You undergo a freakish metamorphosis!");
				polyself(FALSE);
			}
			break;
		/* more odd messages --JJB */
		case 11: You_hear("clanking from the pipes...");
			break;
		case 12: You_hear("snatches of song from among the sewers...");
			break;
		case 19: if (Hallucination) {
		   pline("From the murky drain, a hand reaches up... --oops--");
				break;
			}
		default: pline("You take a sip of %s water.",
			rn2(3) ? (rn2(2) ? "cold" : "warm") : "hot");
	}
}